

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_buffer(REF_DBL *metric,REF_GRID ref_grid)

{
  double dVar1;
  REF_MPI ref_mpi;
  REF_NODE pRVar2;
  REF_DBL *pRVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  long *plVar6;
  REF_NODE pRVar7;
  long lVar8;
  undefined8 uVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  REF_DBL xmax;
  REF_DBL rmax;
  REF_DBL x;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  undefined1 local_98 [16];
  double local_88;
  
  ref_mpi = ref_grid->mpi;
  pRVar2 = ref_grid->node;
  local_c0 = -1e-100;
  local_b8 = 0.0;
  if ((long)pRVar2->max < 1) {
    local_a8 = 0.0;
    local_b0 = -1e-100;
  }
  else {
    plVar6 = pRVar2->global;
    local_b0 = -1e-100;
    local_a8 = 0.0;
    lVar8 = 0;
    do {
      if (-1 < *plVar6) {
        pRVar3 = pRVar2->real;
        dVar13 = *(double *)((long)pRVar3 + lVar8);
        dVar14 = *(double *)((long)pRVar3 + lVar8 + 8);
        if (local_b0 <= dVar13) {
          local_b0 = dVar13;
        }
        dVar1 = *(double *)((long)pRVar3 + lVar8 + 0x10);
        dVar13 = SQRT(dVar1 * dVar1 + dVar13 * dVar13 + dVar14 * dVar14);
        local_c0 = local_b0;
        local_b8 = local_a8;
        if (local_a8 <= dVar13) {
          local_a8 = dVar13;
          local_b8 = dVar13;
        }
      }
      lVar8 = lVar8 + 0x78;
      plVar6 = plVar6 + 1;
    } while ((long)pRVar2->max * 0x78 - lVar8 != 0);
  }
  uVar5 = ref_mpi_max(ref_mpi,&local_a8,&local_b8,3);
  if (uVar5 == 0) {
    uVar5 = ref_mpi_bcast(ref_mpi,&local_b8,1,3);
    if (uVar5 == 0) {
      local_a0 = local_b0;
      uVar5 = ref_mpi_max(ref_mpi,&local_a0,&local_c0,3);
      if (uVar5 == 0) {
        uVar5 = ref_mpi_bcast(ref_mpi,&local_c0,1,3);
        if (uVar5 == 0) {
          pRVar7 = ref_grid->node;
          if (pRVar7->max < 1) {
            return 0;
          }
          lVar8 = 2;
          lVar12 = 0;
          do {
            if (-1 < pRVar7->global[lVar12]) {
              uVar5 = ref_matrix_diag_m(metric,(REF_DBL *)local_98);
              if (uVar5 != 0) {
                uVar10 = (ulong)uVar5;
                pcVar11 = "eigen decomp";
                uVar9 = 0x881;
                goto LAB_001b6112;
              }
              pRVar3 = pRVar2->real;
              local_a8 = SQRT(pRVar3[lVar8] * pRVar3[lVar8] +
                              pRVar3[lVar8 + -2] * pRVar3[lVar8 + -2] +
                              pRVar3[lVar8 + -1] * pRVar3[lVar8 + -1]);
              dVar13 = 1.0;
              if (local_a8 / local_c0 <= 1.0) {
                dVar13 = local_a8 / local_c0;
              }
              dVar14 = dVar13 + dVar13;
              if (1.0 <= dVar14) {
                dVar14 = 1.0;
              }
              dVar14 = (1.0 - dVar14) * -15.0 + dVar14 * -4.0;
              if ((0.5 < dVar13) && (dVar13 < 0.9)) {
                dVar14 = (dVar13 + -0.5) / 0.4;
                dVar14 = (1.0 - dVar14) * -4.0 - dVar14;
              }
              local_b0 = local_b8;
              dVar14 = pow(10.0,(double)(~-(ulong)(dVar13 < 0.9) & 0xbff0000000000000 |
                                        (ulong)dVar14 & -(ulong)(dVar13 < 0.9)));
              dVar14 = dVar14 * local_b0;
              dVar13 = dVar14 * 1e+20 * dVar14;
              if (dVar13 <= -dVar13) {
                dVar13 = -dVar13;
              }
              if (1.0 < dVar13) {
                dVar13 = 1.0 / (dVar14 * dVar14);
                auVar4._8_8_ = dVar13;
                auVar4._0_8_ = dVar13;
                local_98 = minpd(local_98,auVar4);
                if (dVar13 <= local_88) {
                  local_88 = dVar13;
                }
              }
              uVar5 = ref_matrix_form_m((REF_DBL *)local_98,metric);
              if (uVar5 != 0) {
                uVar10 = (ulong)uVar5;
                pcVar11 = "reform m";
                uVar9 = 0x8a3;
                goto LAB_001b6112;
              }
              pRVar7 = ref_grid->node;
            }
            lVar12 = lVar12 + 1;
            lVar8 = lVar8 + 0xf;
            metric = metric + 6;
            if (pRVar7->max <= lVar12) {
              return 0;
            }
          } while( true );
        }
        uVar10 = (ulong)uVar5;
        pcVar11 = "bcast";
        uVar9 = 0x87e;
      }
      else {
        uVar10 = (ulong)uVar5;
        pcVar11 = "mpi max";
        uVar9 = 0x87d;
      }
    }
    else {
      uVar10 = (ulong)uVar5;
      pcVar11 = "bcast";
      uVar9 = 0x87b;
    }
  }
  else {
    uVar10 = (ulong)uVar5;
    pcVar11 = "mpi max";
    uVar9 = 0x87a;
  }
LAB_001b6112:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar9,
         "ref_metric_buffer",uVar10,pcVar11);
  return (REF_STATUS)uVar10;
}

Assistant:

REF_FCN REF_STATUS ref_metric_buffer(REF_DBL *metric, REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL diag_system[12];
  REF_DBL eig;
  REF_INT node;
  REF_DBL r, rmax, x, xmax, exponent, hmin, s, t, smin, smax, emin, emax;

  xmax = -1.0e-100;
  rmax = 0.0;
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    r = sqrt(ref_node_xyz(ref_node, 0, node) * ref_node_xyz(ref_node, 0, node) +
             ref_node_xyz(ref_node, 1, node) * ref_node_xyz(ref_node, 1, node) +
             ref_node_xyz(ref_node, 2, node) * ref_node_xyz(ref_node, 2, node));
    rmax = MAX(rmax, r);
    xmax = MAX(xmax, ref_node_xyz(ref_node, 0, node));
  }
  r = rmax;
  RSS(ref_mpi_max(ref_mpi, &r, &rmax, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &rmax, 1, REF_DBL_TYPE), "bcast");
  x = xmax;
  RSS(ref_mpi_max(ref_mpi, &x, &xmax, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &xmax, 1, REF_DBL_TYPE), "bcast");

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "eigen decomp");

    r = sqrt(ref_node_xyz(ref_node, 0, node) * ref_node_xyz(ref_node, 0, node) +
             ref_node_xyz(ref_node, 1, node) * ref_node_xyz(ref_node, 1, node) +
             ref_node_xyz(ref_node, 2, node) * ref_node_xyz(ref_node, 2, node));

    smin = 0.5;
    smax = 0.9;
    emin = -4.0;
    emax = -1.0;

    s = MIN(1.0, r / xmax);

    t = MIN(s / smin, 1.0);
    exponent = -15.0 * (1.0 - t) + emin * t;

    if (smin < s && s < smax) {
      t = (s - smin) / (smax - smin);
      exponent = (emin) * (1.0 - t) + (emax) * (t);
    }

    if (smax <= s) {
      exponent = emax;
    }

    hmin = rmax * pow(10.0, exponent);

    if (ref_math_divisible(1.0, hmin * hmin)) {
      eig = 1.0 / (hmin * hmin);
      ref_matrix_eig(diag_system, 0) = MIN(ref_matrix_eig(diag_system, 0), eig);
      ref_matrix_eig(diag_system, 1) = MIN(ref_matrix_eig(diag_system, 1), eig);
      ref_matrix_eig(diag_system, 2) = MIN(ref_matrix_eig(diag_system, 2), eig);
    }

    RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform m");
  }
  return REF_SUCCESS;
}